

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.cpp
# Opt level: O3

NodeRecord * __thiscall
embree::sse2::CreateMortonLeaf<4,_embree::Object>::operator()
          (NodeRecord *__return_storage_ptr__,CreateMortonLeaf<4,_embree::Object> *this,
          range<unsigned_int> *current,CachedAllocator *alloc)

{
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  uint uVar3;
  FastAllocator *this_00;
  ThreadLocal *pTVar4;
  ThreadLocal2 *this_01;
  iterator __position;
  UserGeometry *pUVar5;
  undefined8 *puVar6;
  undefined1 auVar7 [16];
  undefined8 *puVar8;
  undefined8 uVar9;
  size_t sVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  char *pcVar14;
  long lVar15;
  undefined1 auVar16 [12];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar18;
  BBox3fa box;
  ThreadLocal2 *local_b0;
  uint local_a8;
  undefined4 local_a4;
  undefined8 **local_a0;
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_98;
  undefined8 *local_80;
  undefined8 *local_78;
  undefined1 uStack_70;
  undefined7 uStack_6f;
  undefined1 local_68 [16];
  ulong local_50;
  range<unsigned_int> *local_48;
  NodeRecord *local_40;
  ThreadLocal2 *local_38;
  undefined1 auVar17 [16];
  
  local_98._8_8_ = local_98._0_8_;
  local_98.m128[1] = 0.0;
  local_98.m128[0] = (float)current->_begin;
  uVar3 = current->_end;
  uVar12 = (ulong)(uVar3 - current->_begin);
  local_80 = (undefined8 *)(uVar12 * 8);
  this_00 = alloc->alloc;
  pTVar4 = alloc->talloc1;
  this_01 = pTVar4->parent;
  if (this_00 != (this_01->alloc)._M_b._M_p) {
    local_a8 = CONCAT31(local_a8._1_3_,1);
    local_b0 = this_01;
    MutexSys::lock(&this_01->mutex);
    if ((this_01->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesUsed + (this_01->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_01->alloc0).end + (this_01->alloc1).end) -
           ((this_01->alloc0).cur + (this_01->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesWasted + (this_01->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_01->alloc0).bytesUsed = 0;
    (this_01->alloc0).bytesWasted = 0;
    (this_01->alloc0).end = 0;
    (this_01->alloc0).allocBlockSize = 0;
    (this_01->alloc0).ptr = (char *)0x0;
    (this_01->alloc0).cur = 0;
    if (this_00 == (FastAllocator *)0x0) {
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
    }
    else {
      (this_01->alloc0).allocBlockSize = this_00->defaultBlockSize;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).allocBlockSize = this_00->defaultBlockSize;
    }
    LOCK();
    (this_01->alloc)._M_b._M_p = this_00;
    UNLOCK();
    local_78 = &FastAllocator::s_thread_local_allocators_lock;
    uStack_70 = 1;
    local_38 = this_01;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    __position._M_current =
         (this_00->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this_00->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&this_00->thread_local_allocators,__position,&local_38);
    }
    else {
      *__position._M_current = this_01;
      pppTVar2 = &(this_00->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar2 = *pppTVar2 + 1;
    }
    MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    if ((char)local_a8 == '\x01') {
      MutexSys::unlock(&local_b0->mutex);
    }
  }
  puVar8 = local_80;
  pTVar4->bytesUsed = pTVar4->bytesUsed + (long)local_80;
  sVar10 = pTVar4->cur;
  uVar11 = (ulong)(-(int)sVar10 & 0xf);
  uVar13 = (long)local_80 + uVar11 + sVar10;
  pTVar4->cur = uVar13;
  local_40 = __return_storage_ptr__;
  if (pTVar4->end < uVar13) {
    pTVar4->cur = sVar10;
    puVar6 = (undefined8 *)pTVar4->allocBlockSize;
    if ((undefined8 *)((long)local_80 * 4) < puVar6 || (long)local_80 * 4 - (long)puVar6 == 0) {
      local_78 = puVar6;
      pcVar14 = (char *)FastAllocator::malloc(this_00,(size_t)&local_78);
      pTVar4->ptr = pcVar14;
      sVar10 = (pTVar4->end - pTVar4->cur) + pTVar4->bytesWasted;
      pTVar4->bytesWasted = sVar10;
      pTVar4->end = (size_t)local_78;
      pTVar4->cur = (size_t)puVar8;
      if (local_78 < puVar8) {
        pTVar4->cur = 0;
        local_78 = (undefined8 *)pTVar4->allocBlockSize;
        pcVar14 = (char *)FastAllocator::malloc(this_00,(size_t)&local_78);
        pTVar4->ptr = pcVar14;
        sVar10 = (pTVar4->end - pTVar4->cur) + pTVar4->bytesWasted;
        pTVar4->bytesWasted = sVar10;
        pTVar4->end = (size_t)local_78;
        pTVar4->cur = (size_t)puVar8;
        if (local_78 < puVar8) {
          pTVar4->cur = 0;
          pcVar14 = (char *)0x0;
          uVar9 = local_98._0_8_;
          goto LAB_00beb9a5;
        }
      }
      pTVar4->bytesWasted = sVar10;
      uVar9 = local_98._0_8_;
    }
    else {
      pcVar14 = (char *)FastAllocator::malloc(this_00,(size_t)&local_80);
      uVar9 = local_98._0_8_;
    }
  }
  else {
    pTVar4->bytesWasted = pTVar4->bytesWasted + uVar11;
    pcVar14 = pTVar4->ptr + (uVar13 - (long)local_80);
    uVar9 = local_98._0_8_;
  }
LAB_00beb9a5:
  local_98 = _DAT_01f7aa00;
  local_50 = uVar12;
  local_48 = current;
  if (uVar3 == (uint)uVar9) {
    auVar16 = DAT_01f7a9f0._0_12_;
  }
  else {
    pUVar5 = this->mesh;
    lVar15 = 0;
    auVar17 = _DAT_01f7a9f0;
    do {
      uVar3 = this->morton[uVar9 + lVar15].field_0.field_0.index;
      local_b0 = (ThreadLocal2 *)(pUVar5->super_AccelSet).super_Geometry.userPtr;
      local_a4 = 0;
      local_a0 = &local_78;
      local_a8 = uVar3;
      (**(code **)&(pUVar5->super_AccelSet).super_Geometry.field_0x58)(&local_b0);
      auVar7[8] = uStack_70;
      auVar7._0_8_ = local_78;
      auVar7._9_7_ = uStack_6f;
      auVar17 = minps(auVar17,auVar7);
      auVar16 = auVar17._0_12_;
      local_98.m128 = (__m128)maxps(local_98.m128,local_68);
      *(uint *)(pcVar14 + lVar15 * 8) = this->geomID_;
      *(uint *)(pcVar14 + lVar15 * 8 + 4) = uVar3;
      lVar15 = lVar15 + 1;
    } while (uVar12 + (uVar12 == 0) != lVar15);
  }
  uVar12 = 7;
  if (local_50 < 7) {
    uVar12 = local_50;
  }
  aVar18.m128[3] = (float)(local_48->_end - local_48->_begin);
  aVar18._0_12_ = auVar16;
  (local_40->ref).ptr = uVar12 | (ulong)pcVar14 | 8;
  (local_40->bounds).lower.field_0 = aVar18;
  (local_40->bounds).upper.field_0 = local_98;
  return local_40;
}

Assistant:

operator() (const range<unsigned>& current, const FastAllocator::CachedAllocator& alloc)
      {
        vfloat4 lower(pos_inf);
        vfloat4 upper(neg_inf);
        size_t items = current.size();
        size_t start = current.begin();
        
        /* allocate leaf node */
        Object* accel = (Object*) alloc.malloc1(items*sizeof(Object),BVH::byteAlignment);
        NodeRef ref = BVH::encodeLeaf((char*)accel,items);
        const UserGeometry* mesh = this->mesh;
        
        BBox3fa bounds = empty;
        for (size_t i=0; i<items; i++)
        {
          const unsigned int index = morton[start+i].index;
          const unsigned int primID = index; 
          bounds.extend(mesh->bounds(primID));
          new (&accel[i]) Object(geomID_,primID);
        }

        BBox3fx box_o = (BBox3fx&)bounds;
#if ROTATE_TREE
        if (N == 4)
          box_o.lower.a = current.size();
#endif
        return NodeRecord(ref,box_o);
      }